

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzload.c
# Opt level: O1

_Bool typesequiv(state *sp,int a,int b)

{
  int iVar1;
  
  if ((sp != (state *)0x0) && (b < sp->typecnt && a < sp->typecnt)) {
    if (sp->ttis[(uint)a].utoff == sp->ttis[(uint)b].utoff) {
      if (((sp->ttis[(uint)a].isdst == sp->ttis[(uint)b].isdst) &&
          (sp->ttis[(uint)a].ttisstd == sp->ttis[(uint)b].ttisstd)) &&
         (sp->ttis[(uint)a].ttisut == sp->ttis[(uint)b].ttisut)) {
        iVar1 = strcmp(sp->chars + sp->ttis[(uint)a].desigidx,sp->chars + sp->ttis[(uint)b].desigidx
                      );
        return iVar1 == 0;
      }
    }
  }
  return false;
}

Assistant:

static bool typesequiv( const struct state * sp, int a, int b )
{
    bool result;

    if ( sp == NULL ||
         a < 0 || a >= sp->typecnt ||
         b < 0 || b >= sp->typecnt )
    {
        result = false;
    }
    else
    {
        const struct ttinfo *  ap = &sp->ttis[ a ];
        const struct ttinfo *  bp = &sp->ttis[ b ];

        result = ( ap->utoff == bp->utoff &&
                   ap->isdst == bp->isdst &&
                   ap->ttisstd == bp->ttisstd &&
                   ap->ttisut == bp->ttisut &&
                   ( strcmp( &sp->chars[ ap->desigidx ], &sp->chars[ bp->desigidx ] ) == 0 )
                 );
    }

    return result;
}